

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O2

void locale_utility_init(UErrorCode *status)

{
  Hashtable *this;
  code *p;
  
  p = service_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_SERVICE,service_cleanup);
  this = (Hashtable *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)p);
  if (this == (Hashtable *)0x0) {
    LocaleUtility_cache = this;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
  }
  else {
    p = (code *)status;
    icu_63::Hashtable::Hashtable(this,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      LocaleUtility_cache = this;
      icu_63::Hashtable::setValueDeleter(this,uhash_deleteHashtable_63);
      return;
    }
    LocaleUtility_cache = this;
    icu_63::Hashtable::~Hashtable(this);
  }
  icu_63::UMemory::operator_delete((UMemory *)this,p);
  LocaleUtility_cache = (Hashtable *)0x0;
  return;
}

Assistant:

static void U_CALLCONV locale_utility_init(UErrorCode &status) {
    using namespace icu;
    U_ASSERT(LocaleUtility_cache == NULL);
    ucln_common_registerCleanup(UCLN_COMMON_SERVICE, service_cleanup);
    LocaleUtility_cache = new Hashtable(status);
    if (U_FAILURE(status)) {
        delete LocaleUtility_cache;
        LocaleUtility_cache = NULL;
        return;
    }
    if (LocaleUtility_cache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    LocaleUtility_cache->setValueDeleter(uhash_deleteHashtable);
}